

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform(connectdata *conn,_Bool *connected,_Bool *dophase_done)

{
  SessionHandle *pSVar1;
  undefined4 *puVar2;
  SMTP *smtp;
  SessionHandle *data;
  CURLcode result;
  _Bool *dophase_done_local;
  _Bool *connected_local;
  connectdata *conn_local;
  
  pSVar1 = conn->data;
  puVar2 = (undefined4 *)(pSVar1->req).protop;
  if (((pSVar1->set).opt_no_body & 1U) != 0) {
    *puVar2 = 1;
  }
  *dophase_done = false;
  *(curl_slist **)(puVar2 + 4) = (pSVar1->set).mail_rcpt;
  if ((((pSVar1->set).upload & 1U) == 0) || ((pSVar1->set).mail_rcpt == (curl_slist *)0x0)) {
    data._4_4_ = smtp_perform_command(conn);
  }
  else {
    data._4_4_ = smtp_perform_mail(conn);
  }
  if (data._4_4_ == CURLE_OK) {
    conn_local._4_4_ = smtp_multi_statemach(conn,dophase_done);
    *connected = (_Bool)((conn->bits).tcpconnect[0] & 1);
  }
  else {
    conn_local._4_4_ = data._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_perform(struct connectdata *conn, bool *connected,
                             bool *dophase_done)
{
  /* This is SMTP and no proxy */
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  DEBUGF(infof(conn->data, "DO phase starts\n"));

  if(data->set.opt_no_body) {
    /* Requested no body means no transfer */
    smtp->transfer = FTPTRANSFER_INFO;
  }

  *dophase_done = FALSE; /* not done yet */

  /* Store the first recipient (or NULL if not specified) */
  smtp->rcpt = data->set.mail_rcpt;

  /* Start the first command in the DO phase */
  if(data->set.upload && data->set.mail_rcpt)
    /* MAIL transfer */
    result = smtp_perform_mail(conn);
  else
    /* SMTP based command (VRFY, EXPN, NOOP, RSET or HELP) */
    result = smtp_perform_command(conn);

  if(result)
    return result;

  /* Run the state-machine */
  result = smtp_multi_statemach(conn, dophase_done);

  *connected = conn->bits.tcpconnect[FIRSTSOCKET];

  if(*dophase_done)
    DEBUGF(infof(conn->data, "DO phase is complete\n"));

  return result;
}